

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::update_auto_sequential(torrent *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  bVar1 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar2),0x8042);
  if ((bVar1) && (iVar2 = num_peers(this), 9 < (int)(iVar2 - (uint)this->m_num_connecting))) {
    iVar2 = num_downloaders(this);
    iVar3 = (uint)this->m_num_seeds - (uint)this->m_num_connecting_seeds;
    this->field_0x5cc = this->field_0x5cc & 0xfd | (9 < iVar3 && iVar2 * 10 <= iVar3) * '\x02';
    return;
  }
  this->field_0x5cc = this->field_0x5cc & 0xfd;
  return;
}

Assistant:

void torrent::update_auto_sequential()
	{
		if (!settings().get_bool(settings_pack::auto_sequential))
		{
			m_auto_sequential = false;
			return;
		}

		if (num_peers() - m_num_connecting < 10)
		{
			// there are too few peers. Be conservative and don't assume it's
			// well seeded until we can connect to more peers
			m_auto_sequential = false;
			return;
		}

		// if there are at least 10 seeds, and there are 10 times more
		// seeds than downloaders, enter sequential download mode
		// (for performance)
		int const downloaders = num_downloaders();
		int const seeds = num_seeds();
		m_auto_sequential = downloaders * 10 <= seeds
			&& seeds > 9;
	}